

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

unsigned_long
cmdline::detail::
lexical_cast_t<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::cast(string *arg)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  bad_cast *this;
  undefined8 in_RDI;
  istringstream ss;
  unsigned_long ret;
  istringstream local_190 [384];
  unsigned_long local_10 [2];
  
  std::__cxx11::istringstream::istringstream(local_190,in_RDI,8);
  plVar3 = (long *)std::istream::operator>>((istream *)local_190,local_10);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1) && (bVar2 = std::ios::eof(), (bVar2 & 1) != 0)) {
    std::__cxx11::istringstream::~istringstream(local_190);
    return local_10[0];
  }
  this = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this);
  __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static Target cast(const std::string& arg) {
        Target ret;
        std::istringstream ss(arg);
        if (!(ss >> ret && ss.eof())) throw std::bad_cast();
        return ret;
    }